

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

ostream * tvm::runtime::operator<<(ostream *os,DLDataType t)

{
  char *pcVar1;
  ostream *poVar2;
  uint8_t type_code;
  string local_40;
  ostream *local_20;
  ostream *os_local;
  ostream *poStack_10;
  DLDataType t_local;
  
  os_local._5_1_ = t.bits;
  os_local._4_1_ = t.code;
  local_20 = os;
  os_local._4_4_ = t;
  if (((os_local._5_1_ == '\x01') && (os_local._6_2_ = t.lanes, os_local._6_2_ == 1)) &&
     (os_local._4_1_ == 1)) {
    std::operator<<(os,"bool");
    poStack_10 = local_20;
  }
  else {
    if (os_local._4_1_ < 0x81) {
      pcVar1 = TypeCode2Str((uint)t & 0xff);
      std::operator<<(os,pcVar1);
    }
    else {
      poVar2 = std::operator<<(os,"custom[");
      GetCustomTypeName_abi_cxx11_(&local_40,(runtime *)(ulong)os_local._4_1_,type_code);
      poVar2 = std::operator<<(poVar2,(string *)&local_40);
      std::operator<<(poVar2,"]");
      std::__cxx11::string::~string((string *)&local_40);
    }
    if (os_local._4_1_ == '\x03') {
      poStack_10 = local_20;
    }
    else {
      std::ostream::operator<<(local_20,(uint)os_local._4_4_ >> 8 & 0xff);
      if (os_local._6_2_ != 1) {
        poVar2 = std::operator<<(local_20,'x');
        std::ostream::operator<<(poVar2,(uint)os_local._4_4_ >> 0x10);
      }
      poStack_10 = local_20;
    }
  }
  return poStack_10;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, DLDataType t) {  // NOLINT(*)
  if (t.bits == 1 && t.lanes == 1 && t.code == kDLUInt) {
    os << "bool"; return os;
  }
  if (t.code < kTVMCustomBegin) {
    os << TypeCode2Str(t.code);
  } else {
    os << "custom[" << GetCustomTypeName(t.code) << "]";
  }
  if (t.code == kTVMOpaqueHandle) return os;
  os << static_cast<int>(t.bits);
  if (t.lanes != 1) {
    os << 'x' << static_cast<int>(t.lanes);
  }
  return os;
}